

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

Maybe<capnp::Schema> __thiscall
capnp::SchemaLoader::tryGet(SchemaLoader *this,uint64_t id,Reader brand,Schema scope)

{
  Reader RVar1;
  bool bVar2;
  uint uVar3;
  Own<capnp::SchemaLoader::Impl,_std::nullptr_t> *pOVar4;
  Impl *pIVar5;
  RawBrandedSchema *this_00;
  RawBrandedSchema *in_RCX;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 extraout_RDX_01;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 aVar6;
  Maybe<capnp::Schema> MVar7;
  Schema local_160;
  Schema local_158;
  byte local_149;
  ArrayPtr<const_capnp::_::RawBrandedSchema::Scope> local_148;
  byte local_132;
  Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> local_130;
  SegmentReader *local_118;
  CapTableReader *pCStack_110;
  void *local_108;
  WirePointer *pWStack_100;
  undefined8 local_f8;
  int iStack_f0;
  undefined4 uStack_ec;
  undefined1 local_e0 [24];
  RawBrandedSchema *brandedSchema;
  undefined1 local_90 [16];
  undefined1 local_80 [24];
  LazyLoadCallback *c;
  LazyLoadCallback *_c2155;
  undefined1 local_38 [8];
  TryGetResult getResult;
  uint64_t id_local;
  SchemaLoader *this_local;
  Schema scope_local;
  
  getResult.callback.ptr = (LazyLoadCallback *)scope.raw;
  kj::MutexGuarded<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_>::lockShared();
  pOVar4 = kj::Locked<const_kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_>::operator->
                     ((Locked<const_kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_> *)
                      &stack0xffffffffffffffb8);
  pIVar5 = kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>::get(pOVar4);
  Impl::tryGet((Impl *)local_38,(uint64_t)pIVar5);
  kj::Locked<const_kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_>::~Locked
            ((Locked<const_kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_> *)
             &stack0xffffffffffffffb8);
  if ((local_38 == (undefined1  [8])0x0) ||
     (*(Initializer **)((long)local_38 + 0x40) != (Initializer *)0x0)) {
    c = kj::_::readMaybe<capnp::SchemaLoader::LazyLoadCallback_const>
                  ((Maybe<const_capnp::SchemaLoader::LazyLoadCallback_&> *)&getResult);
    if ((Impl *)c != (Impl *)0x0) {
      local_80._16_8_ = c;
      (**(_func_int **)(((Impl *)c)->arena).nextChunkSize)(c,id,getResult.callback.ptr);
    }
    kj::MutexGuarded<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_>::lockShared
              ((MutexGuarded<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_> *)local_90,id);
    pOVar4 = kj::Locked<const_kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_>::operator->
                       ((Locked<const_kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_> *)
                        local_90);
    pIVar5 = kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>::get(pOVar4);
    Impl::tryGet((Impl *)local_80,(uint64_t)pIVar5);
    Impl::TryGetResult::operator=((TryGetResult *)local_38,(TryGetResult *)local_80);
    kj::Locked<const_kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_>::~Locked
              ((Locked<const_kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_> *)local_90);
  }
  if ((local_38 == (undefined1  [8])0x0) ||
     (*(Initializer **)((long)local_38 + 0x40) != (Initializer *)0x0)) {
    kj::Maybe<capnp::Schema>::Maybe((Maybe<capnp::Schema> *)this);
    aVar6 = extraout_RDX_01;
  }
  else {
    capnp::schema::Brand::Reader::getScopes((Reader *)&brandedSchema,&brand);
    uVar3 = List<capnp::schema::Brand::Scope,_(capnp::Kind)3>::Reader::size
                      ((Reader *)&brandedSchema);
    if (uVar3 == 0) {
      Schema::Schema(&local_160,(RawBrandedSchema *)((long)local_38 + 0x48));
      kj::Maybe<capnp::Schema>::Maybe((Maybe<capnp::Schema> *)this,&local_160);
      aVar6 = extraout_RDX_00;
    }
    else {
      kj::MutexGuarded<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_>::lockExclusive
                ((MutexGuarded<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_> *)local_e0,id);
      pOVar4 = kj::Locked<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_>::operator->
                         ((Locked<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_> *)local_e0);
      pIVar5 = kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>::get(pOVar4);
      RVar1 = brand;
      local_118 = brand._reader.segment;
      pCStack_110 = brand._reader.capTable;
      local_108 = brand._reader.data;
      pWStack_100 = brand._reader.pointers;
      local_f8._0_4_ = brand._reader.dataSize;
      local_f8._4_2_ = brand._reader.pointerCount;
      local_f8._6_2_ = brand._reader._38_2_;
      brand._reader._40_8_ = RVar1._reader._40_8_;
      iStack_f0 = brand._reader.nestingLimit;
      uStack_ec = brand._reader._44_4_;
      local_132 = 0;
      local_149 = 0;
      brand = RVar1;
      bVar2 = capnp::_::RawBrandedSchema::isUnbound(in_RCX);
      if (bVar2) {
        kj::Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_>::Maybe(&local_130);
        local_132 = 1;
      }
      else {
        local_148 = kj::arrayPtr<capnp::_::RawBrandedSchema::Scope_const>
                              (in_RCX->scopes,(ulong)in_RCX->scopeCount);
        kj::Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_>::Maybe
                  (&local_130,&local_148);
        local_149 = 1;
      }
      RVar1._reader.capTable = pCStack_110;
      RVar1._reader.segment = local_118;
      RVar1._reader.data = local_108;
      RVar1._reader.pointers = pWStack_100;
      RVar1._reader.dataSize = (StructDataBitCount)local_f8;
      RVar1._reader.pointerCount = local_f8._4_2_;
      RVar1._reader._38_2_ = local_f8._6_2_;
      RVar1._reader.nestingLimit = iStack_f0;
      RVar1._reader._44_4_ = uStack_ec;
      this_00 = Impl::makeBranded(pIVar5,(RawSchema *)local_38,RVar1,&local_130);
      if ((local_149 & 1) != 0) {
        kj::Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_>::~Maybe(&local_130);
      }
      if ((local_132 & 1) != 0) {
        kj::Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_>::~Maybe(&local_130);
      }
      kj::Locked<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_>::~Locked
                ((Locked<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_> *)local_e0);
      local_e0._16_8_ = this_00;
      capnp::_::RawBrandedSchema::ensureInitialized(this_00);
      Schema::Schema(&local_158,(RawBrandedSchema *)local_e0._16_8_);
      kj::Maybe<capnp::Schema>::Maybe((Maybe<capnp::Schema> *)this,&local_158);
      aVar6 = extraout_RDX;
    }
  }
  MVar7.ptr.field_1 = aVar6;
  MVar7.ptr._0_8_ = this;
  return (Maybe<capnp::Schema>)MVar7.ptr;
}

Assistant:

kj::Maybe<Schema> SchemaLoader::tryGet(
    uint64_t id, schema::Brand::Reader brand, Schema scope) const {
  auto getResult = impl.lockShared()->get()->tryGet(id);
  if (getResult.schema == nullptr || getResult.schema->lazyInitializer != nullptr) {
    // This schema couldn't be found or has yet to be lazily loaded. If we have a lazy loader
    // callback, invoke it now to try to get it to load this schema.
    KJ_IF_SOME(c, getResult.callback) {
      c.load(*this, id);
    }
    getResult = impl.lockShared()->get()->tryGet(id);
  }
  if (getResult.schema != nullptr && getResult.schema->lazyInitializer == nullptr) {
    if (brand.getScopes().size() > 0) {
      auto brandedSchema = impl.lockExclusive()->get()->makeBranded(
          getResult.schema, brand,
          scope.raw->isUnbound()
              ? kj::Maybe<kj::ArrayPtr<const _::RawBrandedSchema::Scope>>(kj::none)
              : kj::arrayPtr(scope.raw->scopes, scope.raw->scopeCount));
      brandedSchema->ensureInitialized();
      return Schema(brandedSchema);
    } else {
      return Schema(&getResult.schema->defaultBrand);
    }
  } else {
    return kj::none;
  }
}